

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::AllocNodes(RefTable *this,SQUnsignedInteger size)

{
  RefNode **ppRVar1;
  RefNode *pRVar2;
  ulong local_38;
  SQUnsignedInteger n;
  RefNode *temp;
  RefNode *nodes;
  RefNode **bucks;
  SQUnsignedInteger size_local;
  RefTable *this_local;
  
  ppRVar1 = (RefNode **)sq_vm_malloc(size * 0x28);
  pRVar2 = (RefNode *)(ppRVar1 + size);
  n = (SQUnsignedInteger)pRVar2;
  for (local_38 = 0; local_38 < size - 1; local_38 = local_38 + 1) {
    ppRVar1[local_38] = (RefNode *)0x0;
    *(undefined8 *)(n + 0x10) = 0;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)n);
    *(SQUnsignedInteger *)(n + 0x18) = n + 0x20;
    n = n + 0x20;
  }
  ppRVar1[local_38] = (RefNode *)0x0;
  *(undefined8 *)(n + 0x10) = 0;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)n);
  *(undefined8 *)(n + 0x18) = 0;
  this->_freelist = pRVar2;
  this->_nodes = pRVar2;
  this->_buckets = ppRVar1;
  this->_slotused = 0;
  this->_numofslots = size;
  return;
}

Assistant:

void RefTable::AllocNodes(SQUnsignedInteger size)
{
    RefNode **bucks;
    RefNode *nodes;
    bucks = (RefNode **)SQ_MALLOC((size * sizeof(RefNode *)) + (size * sizeof(RefNode)));
    nodes = (RefNode *)&bucks[size];
    RefNode *temp = nodes;
    SQUnsignedInteger n;
    for(n = 0; n < size - 1; n++) {
        bucks[n] = NULL;
        temp->refs = 0;
        new (&temp->obj) SQObjectPtr;
        temp->next = temp+1;
        temp++;
    }
    bucks[n] = NULL;
    temp->refs = 0;
    new (&temp->obj) SQObjectPtr;
    temp->next = NULL;
    _freelist = nodes;
    _nodes = nodes;
    _buckets = bucks;
    _slotused = 0;
    _numofslots = size;
}